

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,char *significand,
          int significand_size,int integral_size,char8_t decimal_point)

{
  size_t sVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar2;
  undefined3 in_register_00000081;
  
  bVar2 = copy_str_noinline<char8_t,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                    (significand,significand + integral_size,out);
  if (CONCAT31(in_register_00000081,decimal_point) != 0) {
    if ((bVar2.container)->capacity_ < (bVar2.container)->size_ + 1) {
      (**(bVar2.container)->_vptr_buffer)(bVar2.container);
    }
    sVar1 = (bVar2.container)->size_;
    (bVar2.container)->size_ = sVar1 + 1;
    (bVar2.container)->ptr_[sVar1] = decimal_point;
    bVar2 = copy_str_noinline<char8_t,char_const*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                      (significand + integral_size,significand + significand_size,bVar2);
    return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar2.container;
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR auto write_significand(OutputIt out, const char* significand,
                                     int significand_size, int integral_size,
                                     Char decimal_point) -> OutputIt {
  out = detail::copy_str_noinline<Char>(significand,
                                        significand + integral_size, out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_str_noinline<Char>(significand + integral_size,
                                         significand + significand_size, out);
}